

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSorterClose(sqlite3 *db,VdbeCursor *pCsr)

{
  VdbeSorter *pSorter_00;
  VdbeSorter *pSorter;
  VdbeCursor *pCsr_local;
  sqlite3 *db_local;
  
  pSorter_00 = (pCsr->uc).pSorter;
  if (pSorter_00 != (VdbeSorter *)0x0) {
    sqlite3VdbeSorterReset(db,pSorter_00);
    sqlite3_free((pSorter_00->list).aMemory);
    sqlite3DbFree(db,pSorter_00);
    (pCsr->uc).pCursor = (BtCursor *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterClose(sqlite3 *db, VdbeCursor *pCsr){
  VdbeSorter *pSorter;
  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  if( pSorter ){
    sqlite3VdbeSorterReset(db, pSorter);
    sqlite3_free(pSorter->list.aMemory);
    sqlite3DbFree(db, pSorter);
    pCsr->uc.pSorter = 0;
  }
}